

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

void __thiscall QToolBarLayout::insertAction(QToolBarLayout *this,int index,QAction *action)

{
  int *piVar1;
  Promoted<long_long,_int> PVar2;
  QToolBarItem *pQVar3;
  parameter_type in_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  QToolBarItem *item;
  QToolBarLayout *in_stack_00000030;
  QList<QToolBarItem_*> *in_stack_ffffffffffffffc8;
  qsizetype local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0;
  piVar1 = qMax<int>(&local_10,&local_c);
  local_c = *piVar1;
  local_18 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4));
  PVar2 = qMin<long_long,int>(&local_18,&local_c);
  local_c = (int)PVar2;
  pQVar3 = createItem(in_stack_00000030,(QAction *)this);
  if (pQVar3 != (QToolBarItem *)0x0) {
    QList<QToolBarItem_*>::insert(in_stack_ffffffffffffffc8,(qsizetype)in_RDI,in_RDX);
    (**(code **)(*in_RDI + 0x70))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::insertAction(int index, QAction *action)
{
    index = qMax(0, index);
    index = qMin(items.size(), index);

    QToolBarItem *item = createItem(action);
    if (item) {
        items.insert(index, item);
        invalidate();
    }
}